

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Osc::renderSin(V2Osc *this,float *dest,int nsamples)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint32_t uVar8;
  float fVar9;
  float fVar10;
  
  iVar3 = this->freq;
  bVar2 = this->ring;
  uVar6 = 0;
  uVar5 = (ulong)(uint)nsamples;
  if (nsamples < 1) {
    uVar5 = uVar6;
  }
  uVar7 = 0x3fffffff - this->cnt;
  uVar8 = this->cnt;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    uVar1 = iVar3 + uVar8;
    uVar4 = uVar8 + 0x40000000;
    if ((int)(uVar8 + 0x40000000) < 0) {
      uVar4 = uVar7;
    }
    this->cnt = uVar1;
    fVar9 = (float)(uVar4 >> 8 | 0x3f800000) * 3.1415927 + -4.712389;
    fVar10 = fVar9 * fVar9;
    fVar9 = (((fVar10 * -0.00018542 + 0.0083143) * fVar10 + -0.16666) * fVar10 + 1.0) * fVar9 *
            this->gain;
    if ((bVar2 & 1U) == 0) {
      fVar9 = dest[uVar6] + fVar9;
    }
    else {
      fVar9 = dest[uVar6] * fVar9;
    }
    dest[uVar6] = fVar9;
    uVar7 = uVar7 - iVar3;
    uVar8 = uVar1;
  }
  return;
}

Assistant:

void renderSin(float *dest, int nsamples)
    {
        COVER("Osc sin");

        // Sine is already a perfectly bandlimited waveform, so we needn't
        // worry about aliasing here.
        for (int i=0; i < nsamples; i++)
        {
            // Brace yourselves: The name is a lie! It's actually a cosine wave!
            uint32_t phase = cnt + 0x40000000; // quarter-turn (pi/2) phase offset
            cnt += freq; // step the oscillator

            // range reduce to [0,pi]
            if (phase & 0x80000000) // Symmetry: cos(x) = cos(-x)
                phase = ~phase; // V2 uses ~ not - which is slightly off but who cares

            // convert to t in [1,2)
            float t = bits2float((phase >> 8) | 0x3f800000); // 1.0f + (phase / (2^31))

            // and then to t in [-pi/2,pi/2)
            // i know the V2 ASM code says "scale/move to (-pi/4 .. pi/4)".
            // trust me, it's lying.
            t = t * fcpi - fc1p5pi;

            output(dest + i, gain * fastsin(t));
        }
    }